

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1ba5289::BIP32PubkeyProvider::ToNormalizedString
          (BIP32PubkeyProvider *this,SigningProvider *arg,string *out,DescriptorCache *cache)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  size_type sVar4;
  const_reference pvVar5;
  CExtPubKey *xpub_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  CExtPubKey *in_RDI;
  long in_FS_OFFSET;
  int k;
  int i;
  KeyPath end_path;
  KeyOriginInfo origin;
  string origin_str;
  CExtKey xprv;
  CExtKey lh_xprv;
  CExtPubKey xpub;
  CKeyID id;
  undefined4 in_stack_fffffffffffffc48;
  StringType in_stack_fffffffffffffc4c;
  undefined4 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc54;
  undefined1 in_stack_fffffffffffffc55;
  undefined1 in_stack_fffffffffffffc56;
  undefined1 in_stack_fffffffffffffc57;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffc58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  DescriptorCache *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  BIP32PubkeyProvider *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc90;
  uint uVar6;
  undefined4 in_stack_fffffffffffffc94;
  char *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  int iVar7;
  int iVar8;
  undefined4 in_stack_fffffffffffffca4;
  int iVar9;
  byte local_331;
  Span<const_unsigned_char> in_stack_fffffffffffffcd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300 [9];
  undefined1 local_1c4 [244];
  undefined1 local_d0 [116];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI[1].chaincode.super_base_blob<256U>.m_data._M_elems + 0x14) == 2) {
    (anonymous_namespace)::BIP32PubkeyProvider::ToString_abi_cxx11_
              (in_stack_fffffffffffffc80,(StringType)((ulong)in_stack_fffffffffffffc78 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffc78 >> 0x18,0));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_RCX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    local_331 = 1;
    goto LAB_00e7d5c7;
  }
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  iVar9 = (int)sVar4;
  do {
    iVar9 = iVar9 + -1;
    if (iVar9 < 0) break;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       (in_stack_fffffffffffffc58,
                        CONCAT17(in_stack_fffffffffffffc57,
                                 CONCAT16(in_stack_fffffffffffffc56,
                                          CONCAT15(in_stack_fffffffffffffc55,
                                                   CONCAT14(in_stack_fffffffffffffc54,
                                                            in_stack_fffffffffffffc50)))));
  } while (-1 < (int)*pvVar5);
  if (iVar9 == -1) {
    (anonymous_namespace)::BIP32PubkeyProvider::ToString_abi_cxx11_
              ((BIP32PubkeyProvider *)
               CONCAT17(in_stack_fffffffffffffc57,
                        CONCAT16(in_stack_fffffffffffffc56,
                                 CONCAT15(in_stack_fffffffffffffc55,
                                          CONCAT14(in_stack_fffffffffffffc54,
                                                   in_stack_fffffffffffffc50)))),
               in_stack_fffffffffffffc4c);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_RCX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(iVar9,in_stack_fffffffffffffca0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    local_331 = 1;
    goto LAB_00e7d5c7;
  }
  KeyOriginInfo::KeyOriginInfo
            ((KeyOriginInfo *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  for (iVar7 = 0; iVar7 <= iVar9; iVar7 = iVar7 + 1) {
    in_stack_fffffffffffffc78 = local_300;
    in_stack_fffffffffffffc80 =
         (BIP32PubkeyProvider *)
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                   (in_stack_fffffffffffffc58,
                    CONCAT17(in_stack_fffffffffffffc57,
                             CONCAT16(in_stack_fffffffffffffc56,
                                      CONCAT15(in_stack_fffffffffffffc55,
                                               CONCAT14(in_stack_fffffffffffffc54,
                                                        in_stack_fffffffffffffc50)))));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_stack_fffffffffffffc58,
               (value_type_conflict2 *)
               CONCAT17(in_stack_fffffffffffffc57,
                        CONCAT16(in_stack_fffffffffffffc56,
                                 CONCAT15(in_stack_fffffffffffffc55,
                                          CONCAT14(in_stack_fffffffffffffc54,
                                                   in_stack_fffffffffffffc50)))));
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  while (iVar8 = iVar7,
        sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48)),
        iVar7 < (int)sVar4) {
    in_stack_fffffffffffffc68 =
         (DescriptorCache *)
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                   (in_stack_fffffffffffffc58,
                    CONCAT17(in_stack_fffffffffffffc57,
                             CONCAT16(in_stack_fffffffffffffc56,
                                      CONCAT15(in_stack_fffffffffffffc55,
                                               CONCAT14(in_stack_fffffffffffffc54,
                                                        in_stack_fffffffffffffc50)))));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_stack_fffffffffffffc58,
               (value_type_conflict2 *)
               CONCAT17(in_stack_fffffffffffffc57,
                        CONCAT16(in_stack_fffffffffffffc56,
                                 CONCAT15(in_stack_fffffffffffffc55,
                                          CONCAT14(in_stack_fffffffffffffc54,
                                                   in_stack_fffffffffffffc50)))));
    iVar7 = iVar8 + 1;
  }
  CPubKey::GetID((CPubKey *)CONCAT44(iVar7,in_stack_fffffffffffffc70));
  this_00 = local_5c;
  xpub_00 = (CExtPubKey *)
            base_blob<160U>::begin
                      ((base_blob<160U> *)
                       CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  base_blob<160U>::begin
            ((base_blob<160U> *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  std::copy<unsigned_char*,unsigned_char*>
            ((uchar *)in_stack_fffffffffffffc68,xpub_00->version,(uchar *)this_00);
  CExtPubKey::CExtPubKey
            ((CExtPubKey *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  CExtKey::CExtKey((CExtKey *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  if (in_RCX != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    DescriptorCache::GetCachedLastHardenedExtPubKey
              (in_stack_fffffffffffffc68,(uint32_t)((ulong)in_RDI >> 0x20),xpub_00);
  }
  uVar1 = CPubKey::IsValid((CPubKey *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48))
  ;
  if ((bool)uVar1) {
LAB_00e7d21b:
    uVar3 = CPubKey::IsValid((CPubKey *)
                             CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    if (!(bool)uVar3) {
      __assert_fail("xpub.pubkey.IsValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                    ,0x21e,
                    "virtual bool (anonymous namespace)::BIP32PubkeyProvider::ToNormalizedString(const SigningProvider &, std::string &, const DescriptorCache *) const"
                   );
    }
    Span<const_unsigned_char>::Span<4>
              ((Span<const_unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),(uchar (*) [4])0xe7d26e
              );
    HexStr_abi_cxx11_(in_stack_fffffffffffffcd0);
    FormatHDKeypath_abi_cxx11_
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,
               SUB81((ulong)in_stack_fffffffffffffc80 >> 0x38,0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    std::operator+(in_stack_fffffffffffffc98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)xpub_00,
                   (char *)this_00);
    EncodeExtPubKey_abi_cxx11_(in_RDI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    FormatHDKeypath_abi_cxx11_
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,
               SUB81((ulong)in_stack_fffffffffffffc80 >> 0x38,0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_RCX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(iVar9,iVar8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    bVar2 = IsRange((BIP32PubkeyProvider *)
                    CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    if ((bVar2) &&
       (std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (this_00,(char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffc56,
                                                           CONCAT15(uVar3,CONCAT14(
                                                  in_stack_fffffffffffffc54,
                                                  in_stack_fffffffffffffc50))))),
       *(int *)(in_RDI[1].chaincode.super_base_blob<256U>.m_data._M_elems + 0x14) != 1)) {
      __assert_fail("m_derive == DeriveType::UNHARDENED",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                    ,0x225,
                    "virtual bool (anonymous namespace)::BIP32PubkeyProvider::ToNormalizedString(const SigningProvider &, std::string &, const DescriptorCache *) const"
                   );
    }
    local_331 = 1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  }
  else {
    CExtKey::CExtKey((CExtKey *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    bVar2 = GetDerivedExtKey(in_stack_fffffffffffffc80,(SigningProvider *)in_stack_fffffffffffffc78,
                             (CExtKey *)CONCAT44(iVar7,in_stack_fffffffffffffc70),
                             (CExtKey *)in_stack_fffffffffffffc68);
    in_stack_fffffffffffffc56 = bVar2;
    if (bVar2) {
      CExtKey::Neuter((CExtKey *)xpub_00);
      memcpy(local_d0,local_1c4,0x71);
    }
    else {
      local_331 = 0;
    }
    uVar6 = (uint)!bVar2;
    CExtKey::~CExtKey((CExtKey *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    if (uVar6 == 0) {
      in_stack_fffffffffffffc90 = 0;
      goto LAB_00e7d21b;
    }
  }
  CExtKey::~CExtKey((CExtKey *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  KeyOriginInfo::~KeyOriginInfo
            ((KeyOriginInfo *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
LAB_00e7d5c7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_331 & 1);
}

Assistant:

bool ToNormalizedString(const SigningProvider& arg, std::string& out, const DescriptorCache* cache) const override
    {
        if (m_derive == DeriveType::HARDENED) {
            out = ToString(StringType::PUBLIC, /*normalized=*/true);

            return true;
        }
        // Step backwards to find the last hardened step in the path
        int i = (int)m_path.size() - 1;
        for (; i >= 0; --i) {
            if (m_path.at(i) >> 31) {
                break;
            }
        }
        // Either no derivation or all unhardened derivation
        if (i == -1) {
            out = ToString();
            return true;
        }
        // Get the path to the last hardened stup
        KeyOriginInfo origin;
        int k = 0;
        for (; k <= i; ++k) {
            // Add to the path
            origin.path.push_back(m_path.at(k));
        }
        // Build the remaining path
        KeyPath end_path;
        for (; k < (int)m_path.size(); ++k) {
            end_path.push_back(m_path.at(k));
        }
        // Get the fingerprint
        CKeyID id = m_root_extkey.pubkey.GetID();
        std::copy(id.begin(), id.begin() + 4, origin.fingerprint);

        CExtPubKey xpub;
        CExtKey lh_xprv;
        // If we have the cache, just get the parent xpub
        if (cache != nullptr) {
            cache->GetCachedLastHardenedExtPubKey(m_expr_index, xpub);
        }
        if (!xpub.pubkey.IsValid()) {
            // Cache miss, or nor cache, or need privkey
            CExtKey xprv;
            if (!GetDerivedExtKey(arg, xprv, lh_xprv)) return false;
            xpub = lh_xprv.Neuter();
        }
        assert(xpub.pubkey.IsValid());

        // Build the string
        std::string origin_str = HexStr(origin.fingerprint) + FormatHDKeypath(origin.path);
        out = "[" + origin_str + "]" + EncodeExtPubKey(xpub) + FormatHDKeypath(end_path);
        if (IsRange()) {
            out += "/*";
            assert(m_derive == DeriveType::UNHARDENED);
        }
        return true;
    }